

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMulti.c
# Opt level: O1

int Gia_ManCountConst0Pos(Aig_Man_t *p)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  
  iVar1 = p->nTruePos;
  if ((long)iVar1 < 1) {
    iVar2 = 0;
  }
  else {
    uVar3 = p->vCos->nSize;
    lVar4 = 0;
    if ((int)uVar3 < 1) {
      uVar3 = 0;
    }
    iVar2 = 0;
    do {
      if (uVar3 <= iVar1 - 1U) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      iVar2 = iVar2 + (uint)(*(ulong *)((long)p->vCos->pArray[lVar4] + 8) == ((ulong)p->pConst1 ^ 1)
                            );
      lVar4 = lVar4 + 1;
    } while (iVar1 != lVar4);
  }
  return iVar2;
}

Assistant:

int Gia_ManCountConst0Pos( Aig_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i, Counter = 0;
    Saig_ManForEachPo( p, pObj, i )
        Counter += (Aig_ObjChild0(pObj) == Aig_ManConst0(p));
    return Counter;
}